

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2DRg(GatherBase *this,bool base_level)

{
  GLint level;
  GLenum type;
  bool bVar1;
  reference pixels_00;
  Vector<float,_2> local_88;
  Vec2 data [4];
  allocator<tcu::Vector<float,_2>_> local_51;
  Vector<float,_2> local_50;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> pixels;
  int i;
  GLenum tex_type;
  GLenum target;
  GLint size;
  GLint csize;
  GLenum format;
  GLenum internal_format;
  bool base_level_local;
  GatherBase *this_local;
  
  tex_type = 0x20;
  if (base_level) {
    tex_type = 0x40;
  }
  pixels.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1406;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             this->tex);
  pixels.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  for (; 0 < (int)tex_type; tex_type = (int)tex_type / 2) {
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               (int)pixels.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0x8230,tex_type,tex_type,0,
               0x8227,pixels.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(void *)0x0);
    tcu::Vector<float,_2>::Vector(&local_50,1.0);
    std::allocator<tcu::Vector<float,_2>_>::allocator(&local_51);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_48,
               (long)(int)(tex_type * tex_type),&local_50,&local_51);
    std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_51);
    type = pixels.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    level = (int)pixels.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    pixels_00 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
                           )local_48,0);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               level,0x8230,tex_type,tex_type,0,0x8227,type,pixels_00);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_48);
    pixels.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)pixels.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  }
  tcu::Vector<float,_2>::Vector(&local_88,0.75,0.8125);
  tcu::Vector<float,_2>::Vector(data,0.5,0.5625);
  tcu::Vector<float,_2>::Vector(data + 1,0.0,0.0625);
  tcu::Vector<float,_2>::Vector(data + 2,0.25,0.3125);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,0x16,0x19,2,2,0x8227,
             pixels.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,&local_88);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,0x10,10,1,1,0x8227,
             pixels.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,&local_88);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,0xb,2,1,1,0x8227,
             pixels.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,data);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,0x18,0xd,1,1,0x8227,
             pixels.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,data + 1);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,9,0xe,1,1,0x8227,
             pixels.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,data + 2);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x8072,0x812f);
  bVar1 = IsFloatingPointTexture(this,0x8230);
  if (bVar1) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               0x2801,0x2700);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2DRg(bool base_level = false)
	{
		GLenum		internal_format = GL_RG32F;
		GLenum		format			= GL_RG;
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, 0);
			std::vector<Vec2> pixels(size * size, Vec2(1.0));
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, &pixels[0]);
		}

		Vec2 data[4] = { Vec2(12. / 16, 13. / 16), Vec2(8. / 16, 9. / 16), Vec2(0. / 16, 1. / 16),
						 Vec2(4. / 16, 5. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}